

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

void __thiscall
MipsOpcodeFormatter::handleImmediate
          (MipsOpcodeFormatter *this,MipsImmediateType type,uint originalValue,uint opcodeFlags)

{
  uint local_3c;
  string local_38;
  float local_14;
  
  local_3c = originalValue;
  if (type == Immediate16) {
    if ((short)originalValue < 0 && (char)((opcodeFlags & 2) >> 1) == '\0') {
      local_14 = (float)(0x10000 - (originalValue & 0xffff));
      tinyformat::format<unsigned_int>(&local_38,"-0x%X",(uint *)&local_14);
      std::__cxx11::string::_M_append((char *)this,(ulong)local_38._M_dataplus._M_p);
    }
    else {
      tinyformat::format<unsigned_int>(&local_38,"0x%X",&local_3c);
      std::__cxx11::string::_M_append((char *)this,(ulong)local_38._M_dataplus._M_p);
    }
  }
  else if (type == ImmediateHalfFloat) {
    local_14 = bitsToFloat(originalValue);
    tinyformat::format<float>(&local_38,"%f",&local_14);
    std::__cxx11::string::_M_append((char *)this,(ulong)local_38._M_dataplus._M_p);
  }
  else {
    tinyformat::format<unsigned_int>(&local_38,"0x%X",&local_3c);
    std::__cxx11::string::_M_append((char *)this,(ulong)local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MipsOpcodeFormatter::handleImmediate(MipsImmediateType type, unsigned int originalValue, unsigned int opcodeFlags)
{
	switch (type)
	{
	case MipsImmediateType::ImmediateHalfFloat:
		buffer += tfm::format("%f", bitsToFloat(originalValue));
		break;
	case MipsImmediateType::Immediate16:
		if (!(opcodeFlags & MO_IPCR) && originalValue & 0x8000)
			buffer += tfm::format("-0x%X", 0x10000-(originalValue & 0xFFFF));
		else
			buffer += tfm::format("0x%X", originalValue);
		break;
	default:
		buffer += tfm::format("0x%X", originalValue);
		break;
	}
}